

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

void __thiscall FOTerm::print(FOTerm *this,ostream *o)

{
  pointer pFVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->tag == Functor) {
    poVar2 = std::operator<<(o,(string *)&this->name);
    std::operator<<(poVar2,"(");
    lVar3 = 0;
    uVar4 = 0;
    while (pFVar1 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 6)) {
      print((FOTerm *)
            ((long)&(pFVar1->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_> + lVar3),o)
      ;
      uVar4 = uVar4 + 1;
      if (uVar4 < (ulong)((long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 6)) {
        std::operator<<(o,", ");
      }
      lVar3 = lVar3 + 0x40;
    }
    std::operator<<(o,")");
    return;
  }
  if (this->tag == Variable) {
    std::operator<<(o,(string *)&this->name);
    return;
  }
  return;
}

Assistant:

void print(std::ostream &o) {
        switch (tag) {
            case FOTermTag::Variable:
                o << name;
                return;
            case FOTermTag::Functor:
                o << name << "(";
                for (int i = 0; i < params.size(); ++i) {
                    params[i].print(o);
                    if (i + 1 < params.size()) o << ", ";
                }
                o << ")";
        }
    }